

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

sexp_conflict sexp_bit_count(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  long lVar1;
  sexp_conflict psVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (((ulong)x & 1) != 0) {
    uVar5 = (long)x >> 0x3f ^ (long)x >> 1;
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    return (sexp_conflict)
           (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x37 | 1);
  }
  if ((((ulong)x & 2) == 0) && (x->tag == 0xc)) {
    lVar1 = (x->value).fileno.fd;
    if (0 < lVar1) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        uVar5 = *(ulong *)((long)&x->value + lVar4 * 8 + 0x10);
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        lVar3 = lVar3 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
      return (sexp_conflict)(lVar3 * 2 + 1);
    }
    return (sexp_conflict)0x1;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2);
  return psVar2;
}

Assistant:

sexp sexp_bit_count (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  sexp res;
  sexp_sint_t i;
#if SEXP_USE_BIGNUMS
  sexp_uint_t count;
#endif
  if (sexp_fixnump(x)) {
    i = sexp_unbox_fixnum(x);
    res = sexp_make_fixnum(bit_count(i<0 ? ~i : i));
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    for (i=count=0; i<(sexp_sint_t)sexp_bignum_length(x); i++)
      count += bit_count(sexp_bignum_data(x)[i]);
    res = sexp_make_fixnum(count);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return res;
}